

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

int __thiscall
GrcFont::GetGlyphMetric(GrcFont *this,gid16 wGlyphID,GlyphMetric gmet,GdlObject *pgdlobj)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  gid16 wGlyphID_00;
  gid16 wGlyphID_01;
  gid16 wGlyphID_02;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint nAdvWid;
  allocator local_1a1;
  int nLsb;
  uint local_19c;
  vector<int,_std::allocator<int>_> vnEndPt;
  vector<int,_std::allocator<int>_> vnY;
  vector<int,_std::allocator<int>_> vnX;
  string local_138;
  string local_118;
  vector<bool,_std::allocator<bool>_> vfOnCurve;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (gmet == kgmetAdvHeight) {
    return 0;
  }
  if (gmet == kgmetDescent) {
    iVar3 = TtfUtil::FontDescent(this->m_pOs2);
    return iVar3;
  }
  if (gmet == kgmetAscent) {
    iVar3 = TtfUtil::FontAscent(this->m_pOs2);
    return iVar3;
  }
  if ((gmet < kgmetAdvHeight) && ((0x103U >> (gmet & 0x1f) & 1) != 0)) {
    bVar2 = TtfUtil::HorMetrics(wGlyphID,this->m_pHmtx,this->m_cHmtx,this->m_pHhea,&nLsb,&nAdvWid);
    if (!bVar2) {
      std::__cxx11::string::string
                ((string *)&local_50,"Unable to get horizontal metrics for glyph ",
                 (allocator *)&vfOnCurve);
      GdlGlyphDefn::GlyphIDString_abi_cxx11_(&local_70,(GdlGlyphDefn *)(ulong)wGlyphID,wGlyphID_00);
      GrcErrorList::AddError(&g_errorList,0x78,pgdlobj,&local_50,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return -0x80000000;
    }
    if (gmet == kgmetLsb) {
      return nLsb;
    }
    if (gmet == kgmetAdvWidth) {
      return nAdvWid;
    }
  }
  uVar13 = (uint)wGlyphID;
  bVar2 = TtfUtil::IsSpace(wGlyphID,this->m_pLoca,this->m_cLoca,this->m_pHead);
  if (bVar2) {
    if (gmet == kgmetRsb) {
      return nAdvWid;
    }
    std::__cxx11::string::string
              ((string *)&local_90,"Requesting bounding box metric for white space glyph ",
               (allocator *)&vfOnCurve);
    GdlGlyphDefn::GlyphIDString_abi_cxx11_(&local_b0,(GdlGlyphDefn *)(ulong)uVar13,wGlyphID_01);
    std::__cxx11::string::string((string *)&local_d0,"; 0 will be used",(allocator *)&vnEndPt);
    GrcErrorList::AddWarning(&g_errorList,0x1fd,pgdlobj,&local_90,&local_b0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    return 0;
  }
  vnEndPt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vnX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vnY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  vnEndPt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vnEndPt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vnX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vnX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  vnY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vnY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  iVar3 = GetGlyfPts(this,wGlyphID,&vnEndPt,&vnX,&vnY,&vfOnCurve);
  if (iVar3 == 0) {
switchD_001493b1_default:
    std::__cxx11::string::string
              ((string *)&local_118,"Unable to get bounding box for glyph ",&local_1a1);
    GdlGlyphDefn::GlyphIDString_abi_cxx11_(&local_138,(GdlGlyphDefn *)(ulong)wGlyphID,wGlyphID_02);
    GrcErrorList::AddWarning(&g_errorList,0x79,pgdlobj,&local_118,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    iVar6 = -0x80000000;
  }
  else {
    uVar7 = (ulong)((long)vnEndPt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)vnEndPt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    uVar10 = 0;
    uVar8 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar8 = uVar10;
    }
    iVar3 = -1;
    iVar4 = -0x80000000;
    iVar5 = 0x7fffffff;
    iVar6 = 0x7fffffff;
    iVar9 = -0x80000000;
    for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
      iVar11 = iVar3 + 1;
      iVar3 = vnEndPt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar10];
      if (iVar3 != iVar11) {
        for (lVar12 = (long)iVar11; lVar12 <= iVar3; lVar12 = lVar12 + 1) {
          iVar11 = vnX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start[lVar12];
          if (iVar11 <= iVar5) {
            iVar5 = iVar11;
          }
          iVar1 = vnY.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar12];
          if (iVar1 <= iVar6) {
            iVar6 = iVar1;
          }
          if (iVar4 <= iVar11) {
            iVar4 = iVar11;
          }
          if (iVar9 <= iVar1) {
            iVar9 = iVar1;
          }
        }
      }
    }
    local_19c = uVar13;
    switch(gmet) {
    case kgmetRsb:
      iVar5 = (iVar5 + nAdvWid) - (iVar4 + nLsb);
    case kgmetBbLeft:
      iVar6 = iVar5;
      break;
    case kgmetBbBottom:
      break;
    case kgmetBbHeight:
      iVar9 = iVar9 - iVar6;
    case kgmetBbTop:
      iVar6 = iVar9;
      break;
    case kgmetBbWidth:
      iVar4 = iVar4 - iVar5;
    case kgmetBbRight:
      iVar6 = iVar4;
      break;
    default:
      goto switchD_001493b1_default;
    }
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&vfOnCurve.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vnY.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vnX.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vnEndPt.super__Vector_base<int,_std::allocator<int>_>);
  return iVar6;
}

Assistant:

int GrcFont::GetGlyphMetric(gid16 wGlyphID, GlyphMetric gmet, GdlObject * pgdlobj)
{
	Assert(m_pFile);
	Assert(m_pLoca);
	Assert(m_pGlyf);
	Assert(m_pOs2);
	Assert(m_pHmtx);
	Assert(m_pHhea);

	switch(gmet)
	{
	case kgmetAscent:
		return TtfUtil::FontAscent(m_pOs2);
	case kgmetDescent:
		return TtfUtil::FontDescent(m_pOs2);
	case kgmetAdvHeight: // TODO AlanW (SharonC): eventually the vmtx table will be needed?
		return 0;
	default:
		break;	// fall through
	}

	unsigned int nAdvWid;
    int nLsb;
	if (gmet == kgmetAdvWidth || gmet == kgmetLsb || gmet == kgmetRsb)
	{
		if (!TtfUtil::HorMetrics(wGlyphID, m_pHmtx, m_cHmtx, m_pHhea, nLsb, nAdvWid))
		{
			g_errorList.AddError(120, pgdlobj, 
				"Unable to get horizontal metrics for glyph ", 
				GdlGlyphDefn::GlyphIDString(wGlyphID));
			return INT_MIN;
		}

		switch(gmet)
		{
		case kgmetAdvWidth:
			return nAdvWid;
		case kgmetLsb: // Review: should we return xMin instead?
			return nLsb;
		default:
		    break;
		// handle Rsb below
		}
	}

	if (TtfUtil::IsSpace(wGlyphID, m_pLoca, m_cLoca, m_pHead))
	{
		if (gmet == kgmetRsb)
			return nAdvWid; // for space. RSB same as adv width to agree with compiler

		g_errorList.AddWarning(509, pgdlobj, 
			"Requesting bounding box metric for white space glyph ", 
			GdlGlyphDefn::GlyphIDString(wGlyphID), 
			"; 0 will be used");
		return 0; // for space, all BB metrics are zero
	}

	// Find bounding box metrics.
	/*
	Normally would use TtfUtil::GlyfBox but attachment points alter the metrics as follows.
	Normally the min and max values stored for each glyph also reflect the visual
	appearance of the glyph. When attachment points are added the min and max values
	may increase but the appearance of the glyph (the black part) will not change since
	attachment points aren't visible. We want the metrics returned here to match the 
	appearance of the the glyph and not be the min and max values with attachment points.
	The GDL author will be familiar with former which is also more intuitive to use.
	The font could be adjusted so attachment points don't affect min and max values
	but that would add a step to the font production process and may produce
	unexpected side effects.
	The bounding box metrics returned from Windows (GetGlyphMetrics) disregard the
	min and max values for each glyph and match the visual appearance. Presumably this
	is related to the way the Windows rasterizer discards attachment points. This means
	the Graphite engine should obtain the same metrics as are returned here.
	Attachment points in this context are points that are alone on their own
	contour (or path), so they can easily be referenced by path number (GPath in GDL).
	*/

	std::vector<int> vnEndPt, vnX, vnY;
	std::vector<bool> vfOnCurve;

	int xMin = INT_MAX;
	int yMin = INT_MAX;
	int xMax = INT_MIN;
	int yMax = INT_MIN;

	if (GetGlyfPts(wGlyphID, &vnEndPt, &vnX, &vnY, &vfOnCurve))
	{
		int nFirstPt = 0;
		int nSecondPt = -1;	// so nFirstPt initialized to zero in loop below
		int cEndPoints = signed(vnEndPt.size());
		int i, j;
		for (i = 0; i < cEndPoints; i++)
		{
			nFirstPt = nSecondPt + 1;
			nSecondPt = vnEndPt[i];
			if (nSecondPt - nFirstPt) // throw out point on contour with single point
			{
				for (j = nFirstPt; j <= nSecondPt; j++)
				{
					xMin = Min(xMin, vnX[j]);
					yMin = Min(yMin, vnY[j]);
					xMax = Max(xMax, vnX[j]);
					yMax = Max(yMax, vnY[j]);
				}
			}
		}

		switch(gmet)
		{
		case kgmetBbTop:
			return yMax;
		case kgmetBbBottom:
			return yMin;
		case kgmetBbLeft:
			return xMin;
		case kgmetBbRight:
			return xMax;
		case kgmetBbWidth:
			return xMax - xMin;
		case kgmetBbHeight:
			return yMax - yMin;
		case kgmetRsb:
			return nAdvWid - nLsb - (xMax - xMin);
		default:
		    break;
		}
	}

	g_errorList.AddWarning(121, pgdlobj, 
		"Unable to get bounding box for glyph ", 
		GdlGlyphDefn::GlyphIDString(wGlyphID));
	return INT_MIN;
}